

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_test.cc
# Opt level: O0

void leveldb::log::_Test_UnexpectedFullType::_RunIt(void)

{
  undefined1 local_98 [8];
  _Test_UnexpectedFullType t;
  
  _Test_UnexpectedFullType((_Test_UnexpectedFullType *)local_98);
  _Run((_Test_UnexpectedFullType *)local_98);
  ~_Test_UnexpectedFullType((_Test_UnexpectedFullType *)local_98);
  return;
}

Assistant:

TEST(LogTest, UnexpectedFullType) {
  Write("foo");
  Write("bar");
  SetByte(6, kFirstType);
  FixChecksum(0, 3);
  ASSERT_EQ("bar", Read());
  ASSERT_EQ("EOF", Read());
  ASSERT_EQ(3, DroppedBytes());
  ASSERT_EQ("OK", MatchError("partial record without end"));
}